

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O2

BranchJumpTableWrapper * BranchJumpTableWrapper::New(JitArenaAllocator *allocator,uint tableSize)

{
  BranchJumpTableWrapper *pBVar1;
  void **ppvVar2;
  
  pBVar1 = (BranchJumpTableWrapper *)new<Memory::JitArenaAllocator>(0x20,allocator,0x3d6ef4);
  pBVar1->labelInstr = (LabelInstr *)0x0;
  pBVar1->jmpTable = (void **)0x0;
  pBVar1->defaultTarget = (void *)0x0;
  pBVar1->tableSize = tableSize;
  ppvVar2 = Memory::AllocateArray<Memory::JitArenaAllocator,void*,false>
                      ((Memory *)allocator,(JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero
                       ,0,(ulong)tableSize);
  pBVar1->jmpTable = ppvVar2;
  return pBVar1;
}

Assistant:

static BranchJumpTableWrapper* New(JitArenaAllocator * allocator, uint tableSize)
    {
        BranchJumpTableWrapper * branchTargets = JitAnew(allocator, BranchJumpTableWrapper, tableSize);

        //Create the jump table for integers

        void* * jmpTable = JitAnewArrayZ(allocator, void*, tableSize);
        branchTargets->jmpTable = jmpTable;
        return branchTargets;
    }